

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeinfo.c
# Opt level: O3

void prf_nodeinfo_exit(void)

{
  prf_nodeinfo_t **id;
  uint uVar1;
  ulong uVar2;
  
  uVar1 = prf_array_count(nodetypes);
  id = nodetypes;
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      if (id[uVar2] != (prf_nodeinfo_t *)0x0) {
        free(id[uVar2]->name);
        free(id[uVar2]);
      }
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  prf_array_free(id);
  nodetypes = (prf_nodeinfo_t **)0x0;
  return;
}

Assistant:

void
prf_nodeinfo_exit(
    void )
{
    int i, count;
    count = prf_array_count(nodetypes);
    for ( i = 0; i < count; i++ ) {
        if ( nodetypes[i] != NULL ) {
            free(nodetypes[i]->name);
            free(nodetypes[i]);
        }
    }
    prf_array_free(nodetypes);
    nodetypes = NULL;
}